

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx_impl.c
# Opt level: O3

memory_allocator_impl memory_allocator_nginx_create(void *ctx)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)(**(code **)((long)ctx + 8))(*ctx,0x20);
  if (puVar2 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)((long)ctx + 8);
    *puVar2 = *ctx;
    puVar2[1] = uVar1;
    uVar1 = *(undefined8 *)((long)ctx + 0x18);
    puVar2[2] = *(undefined8 *)((long)ctx + 0x10);
    puVar2[3] = uVar1;
  }
  return puVar2;
}

Assistant:

memory_allocator_impl memory_allocator_nginx_create(void *ctx)
{
	memory_allocator_nginx_ctx nginx_ctx = (memory_allocator_nginx_ctx)ctx;

	memory_allocator_nginx_impl nginx_impl = nginx_ctx->palloc(nginx_ctx->pool, sizeof(struct memory_allocator_nginx_impl_type));

	if (nginx_impl == NULL)
	{
		return NULL;
	}

	nginx_impl->pool = nginx_ctx->pool;
	nginx_impl->palloc = nginx_ctx->palloc;
	nginx_impl->pcopy = nginx_ctx->pcopy;
	nginx_impl->pfree = nginx_ctx->pfree;

	return (memory_allocator_impl)nginx_impl;
}